

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
visitor_test_should_parse_utc_timestamp_with_microseconds_Test::TestBody
          (visitor_test_should_parse_utc_timestamp_with_microseconds_Test *this)

{
  char **this_00;
  _Optional_payload_base<int> _Var1;
  char *pcVar2;
  bool bVar3;
  undefined1 local_88 [8];
  Time time;
  time_t t;
  tm tm;
  AssertionResult gtest_ar;
  _Storage<int,_true> local_18;
  bool bStack_14;
  undefined3 uStack_13;
  
  Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast
            ((Time *)local_88,"20171105-14:09:30.125456",0x18);
  time.m_usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)local_88;
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  t = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r((time_t *)&time.m_usec,(tm *)&t);
  _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,0x75);
  this_00 = &tm.tm_zone;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)this_00,"tm.tm_year","117",&tm.tm_mday,&local_18._M_value);
  if ((char)tm.tm_zone == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x2b3,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (_local_18 != (_Optional_payload_base<int>)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
        (**(code **)(*(long *)_local_18 + 8))();
      }
      _local_18 = (_Optional_payload_base<int>)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,10);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)this_00,"tm.tm_mon","10",&tm.tm_hour,&local_18._M_value);
    if ((char)tm.tm_zone == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x2b4,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (_local_18 != (_Optional_payload_base<int>)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
          (**(code **)(*(long *)_local_18 + 8))();
        }
        _local_18 = (_Optional_payload_base<int>)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,5);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)this_00,"tm.tm_mday","5",&tm.tm_min,&local_18._M_value);
      if ((char)tm.tm_zone == '\0') {
        testing::Message::Message((Message *)&local_18);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x2b5,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (_local_18 != (_Optional_payload_base<int>)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
            (**(code **)(*(long *)_local_18 + 8))();
          }
          _local_18 = (_Optional_payload_base<int>)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,0xe);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)this_00,"tm.tm_hour","14",&tm.tm_sec,&local_18._M_value);
        if ((char)tm.tm_zone == '\0') {
          testing::Message::Message((Message *)&local_18);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x2b6,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
          if (_local_18 != (_Optional_payload_base<int>)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
              (**(code **)(*(long *)_local_18 + 8))();
            }
            _local_18 = (_Optional_payload_base<int>)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,9);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)this_00,"tm.tm_min","9",(int *)((long)&t + 4),&local_18._M_value);
          if ((char)tm.tm_zone == '\0') {
            testing::Message::Message((Message *)&local_18);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x2b7,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
            if (_local_18 != (_Optional_payload_base<int>)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
                (**(code **)(*(long *)_local_18 + 8))();
              }
              _local_18 = (_Optional_payload_base<int>)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,0x1e);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)this_00,"tm.tm_sec","30",(int *)&t,&local_18._M_value);
            if ((char)tm.tm_zone == '\0') {
              testing::Message::Message((Message *)&local_18);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x2b8,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
              if (_local_18 != (_Optional_payload_base<int>)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
                  (**(code **)(*(long *)_local_18 + 8))();
                }
                _local_18 = (_Optional_payload_base<int>)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_18 = (_Storage<int,_true>)(undefined4)time.m_time;
              bStack_14 = (bool)time.m_time._4_1_;
              uStack_13 = time.m_time._5_3_;
              _Var1 = _local_18;
              bStack_14 = SUB81((ulong)time.m_time >> 0x20,0);
              bVar3 = bStack_14 == false;
              _local_18 = _Var1;
              if (bVar3) {
LAB_008d416c:
                std::__throw_bad_optional_access();
              }
              gtest_ar.message_.ptr_._0_4_ = 0x7d;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)this_00,"time.msec().value()","125",&local_18._M_value,
                         (int *)&gtest_ar.message_);
              if ((char)tm.tm_zone == '\0') {
                testing::Message::Message((Message *)&local_18);
                if (gtest_ar._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                           ,0x2ba,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
                if (_local_18 != (_Optional_payload_base<int>)0x0) {
                  bVar3 = testing::internal::IsTrue(true);
                  if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
                    (**(code **)(*(long *)_local_18 + 8))();
                  }
                  local_18 = (_Storage<int,_true>)0x0;
                  bStack_14 = false;
                  uStack_13 = 0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                _local_18 = (_Optional_payload_base<int>)
                            time.m_msec.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>;
                _Var1 = _local_18;
                bStack_14 = time.m_msec.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_engaged;
                bVar3 = bStack_14 == false;
                _local_18 = _Var1;
                if (bVar3) goto LAB_008d416c;
                gtest_ar.message_.ptr_._0_4_ = 0x1c8;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)this_00,"time.usec().value()","456",&local_18._M_value,
                           (int *)&gtest_ar.message_);
                if ((char)tm.tm_zone == '\0') {
                  testing::Message::Message((Message *)&local_18);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                             ,699,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_)
                  ;
                  if (_local_18 != (_Optional_payload_base<int>)0x0) {
                    bVar3 = testing::internal::IsTrue(true);
                    if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
                      (**(code **)(*(long *)_local_18 + 8))();
                    }
                    local_18 = (_Storage<int,_true>)0x0;
                    bStack_14 = false;
                    uStack_13 = 0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_timestamp_with_microseconds)
{
    const char* str = "20171105-14:09:30.125456";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_year, 117);
    ASSERT_EQ(tm.tm_mon, 10);
    ASSERT_EQ(tm.tm_mday, 5);
    ASSERT_EQ(tm.tm_hour, 14);
    ASSERT_EQ(tm.tm_min, 9);
    ASSERT_EQ(tm.tm_sec, 30);

    ASSERT_EQ(time.msec().value(), 125);
    ASSERT_EQ(time.usec().value(), 456);
}